

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

char * __thiscall
Memory::Recycler::TryLargeAlloc
          (Recycler *this,HeapInfo *heap,size_t size,ObjectInfoBits attributes,bool nothrow)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *address;
  LargeHeapBlock *pLVar4;
  undefined6 in_register_0000000a;
  ulong size_00;
  ulong size_01;
  
  if (0x3ff < (uint)CONCAT62(in_register_0000000a,attributes)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x508,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar2) goto LAB_007159c0;
    *puVar3 = 0;
  }
  if (size == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x509,"(size != 0)","size != 0");
    if (!bVar2) goto LAB_007159c0;
    *puVar3 = 0;
  }
  size_01 = size + 0xf & 0xfffffffffffffff0;
  if (size_01 == 0) {
    if (!nothrow) {
      (*this->outOfMemoryFunc)();
    }
LAB_007159ac:
    address = (char *)0x0;
  }
  else {
    pLVar4 = (heap->largeObjectBucket).largeBlockList;
    if ((pLVar4 == (LargeHeapBlock *)0x0) ||
       (address = LargeHeapBlock::Alloc(pLVar4,size_01,attributes), size_00 = size_01,
       address == (char *)0x0)) {
      if (this->disableCollectOnAllocationHeuristics == false) {
        CollectNow<(Memory::CollectionFlags)404819971>(this);
      }
      if ((((this->isPageHeapEnabled != true) || ((attributes & ClientTrackableObjectBits) != NoBit)
           ) || ((heap->largeObjectBucket).super_HeapBucket.isPageHeapEnabled == false)) ||
         (address = LargeHeapBucket::PageHeapAlloc
                              (&heap->largeObjectBucket,this,size_01,size,attributes,
                               heap->pageHeapMode,nothrow), size_00 = size, address == (char *)0x0))
      {
        pLVar4 = HeapInfo::AddLargeHeapBlock(heap,size_01);
        if (pLVar4 == (LargeHeapBlock *)0x0) goto LAB_007159ac;
        address = LargeHeapBlock::Alloc(pLVar4,size_01,attributes);
        size_00 = size_01;
        if (address == (char *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0x544,"(memBlock != nullptr)","memBlock != nullptr");
          if (!bVar2) {
LAB_007159c0:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
        }
      }
    }
    VerifyLargeAllocZeroFill(this,address,size_00,attributes);
  }
  return address;
}

Assistant:

char *
Recycler::TryLargeAlloc(HeapInfo * heap, size_t size, ObjectInfoBits attributes, bool nothrow)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);
    Assert(size != 0);

    size_t sizeCat = HeapInfo::GetAlignedSizeNoCheck(size);
    if (sizeCat == 0)
    {
        // overflow scenario
        // if onthrow is false, throw out of memory
        // otherwise, return null
        if (nothrow == false)
        {
            this->OutOfMemory();
        }
        return nullptr;
    }

    char * memBlock;
    if (heap->largeObjectBucket.largeBlockList != nullptr)
    {
        memBlock = heap->largeObjectBucket.largeBlockList->Alloc(sizeCat, attributes);
        if (memBlock != nullptr)
        {
#ifdef RECYCLER_ZERO_MEM_CHECK
            VerifyLargeAllocZeroFill(memBlock, sizeCat, attributes);
#endif
            return memBlock;
        }
    }

    // We don't care whether a GC happened here or not, because we are not reusing freed
    // large objects. We might try to allocate from existing block if we implement
    // large object reuse.
    if (!this->disableCollectOnAllocationHeuristics)
    {
        CollectNow<CollectOnAllocation>();
    }

#ifdef RECYCLER_PAGE_HEAP
    if (IsPageHeapEnabled())
    {
        if (heap->largeObjectBucket.IsPageHeapEnabled(attributes))
        {
            memBlock = heap->largeObjectBucket.PageHeapAlloc(this, sizeCat, size, (ObjectInfoBits)attributes, heap->pageHeapMode, nothrow);
            if (memBlock != nullptr)
            {
#ifdef RECYCLER_ZERO_MEM_CHECK
                VerifyLargeAllocZeroFill(memBlock, size, attributes);
#endif
                return memBlock;
            }
        }
    }
#endif

    LargeHeapBlock * heapBlock = heap->AddLargeHeapBlock(sizeCat);
    if (heapBlock == nullptr)
    {
        return nullptr;
    }
    memBlock = heapBlock->Alloc(sizeCat, attributes);
    Assert(memBlock != nullptr);
#ifdef RECYCLER_ZERO_MEM_CHECK
    VerifyLargeAllocZeroFill(memBlock, sizeCat, attributes);
#endif
    return memBlock;
}